

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FAudio_operationset.c
# Opt level: O3

void FAudio_OPERATIONSET_Execute(FAudio *audio)

{
  FAudio_OPERATIONSET_Operation *pFVar1;
  FAudioFreeFunc p_Var2;
  FAudio_OPERATIONSET_Operation *pFVar3;
  FAudio_OPERATIONSET_Type FVar4;
  long lVar5;
  
  FAudio_PlatformLockMutex(audio->operationLock);
  pFVar3 = audio->committedOperations;
  do {
    if (pFVar3 == (FAudio_OPERATIONSET_Operation *)0x0) {
      audio->committedOperations = (FAudio_OPERATIONSET_Operation *)0x0;
      FAudio_PlatformUnlockMutex(audio->operationLock);
      return;
    }
    pFVar1 = pFVar3->next;
    FVar4 = pFVar3->Type;
    switch(FVar4) {
    case FAUDIOOP_ENABLEEFFECT:
      FAudioVoice_EnableEffect(pFVar3->Voice,(pFVar3->Data).SetEffectParameters.EffectIndex,0);
      break;
    case FAUDIOOP_DISABLEEFFECT:
      FAudioVoice_DisableEffect(pFVar3->Voice,(pFVar3->Data).SetEffectParameters.EffectIndex,0);
      break;
    case FAUDIOOP_SETEFFECTPARAMETERS:
      FAudioVoice_SetEffectParameters
                (pFVar3->Voice,(pFVar3->Data).SetEffectParameters.EffectIndex,
                 (pFVar3->Data).SetEffectParameters.pParameters,
                 (pFVar3->Data).SetEffectParameters.ParametersByteSize,0);
      break;
    case FAUDIOOP_SETFILTERPARAMETERS:
      FAudioVoice_SetFilterParameters
                (pFVar3->Voice,(FAudioFilterParameters *)&(pFVar3->Data).EnableEffect,0);
      break;
    case FAUDIOOP_SETOUTPUTFILTERPARAMETERS:
      FAudioVoice_SetOutputFilterParameters
                (pFVar3->Voice,(pFVar3->Data).SetOutputFilterParameters.pDestinationVoice,
                 (FAudioFilterParameters *)&(pFVar3->Data).SetFilterParameters.Parameters.OneOverQ,0
                );
      break;
    case FAUDIOOP_SETVOLUME:
      FAudioVoice_SetVolume(pFVar3->Voice,(float)(pFVar3->Data).EnableEffect.EffectIndex,0);
      break;
    case FAUDIOOP_SETCHANNELVOLUMES:
      FAudioVoice_SetChannelVolumes
                (pFVar3->Voice,(pFVar3->Data).SetEffectParameters.EffectIndex,
                 (pFVar3->Data).SetChannelVolumes.pVolumes,0);
      break;
    case FAUDIOOP_SETOUTPUTMATRIX:
      FAudioVoice_SetOutputMatrix
                (pFVar3->Voice,(pFVar3->Data).SetOutputFilterParameters.pDestinationVoice,
                 (pFVar3->Data).SetOutputMatrix.SourceChannels,
                 (pFVar3->Data).SetOutputMatrix.DestinationChannels,
                 (pFVar3->Data).SetOutputMatrix.pLevelMatrix,0);
      break;
    case FAUDIOOP_START:
      FAudioSourceVoice_Start(pFVar3->Voice,(pFVar3->Data).SetEffectParameters.EffectIndex,0);
      break;
    case FAUDIOOP_STOP:
      FAudioSourceVoice_Stop(pFVar3->Voice,(pFVar3->Data).SetEffectParameters.EffectIndex,0);
      break;
    case FAUDIOOP_EXITLOOP:
      FAudioSourceVoice_ExitLoop(pFVar3->Voice,0);
      break;
    case FAUDIOOP_SETFREQUENCYRATIO:
      FAudioSourceVoice_SetFrequencyRatio
                (pFVar3->Voice,(float)(pFVar3->Data).EnableEffect.EffectIndex,0);
      break;
    default:
      goto switchD_0011c0c5_default;
    }
    FVar4 = pFVar3->Type;
switchD_0011c0c5_default:
    p_Var2 = audio->pFree;
    lVar5 = 0x18;
    if ((FVar4 == FAUDIOOP_SETEFFECTPARAMETERS) || (FVar4 == FAUDIOOP_SETCHANNELVOLUMES)) {
LAB_0011c1e1:
      (*p_Var2)(*(void **)((long)&pFVar3->Type + lVar5));
    }
    else if (FVar4 == FAUDIOOP_SETOUTPUTMATRIX) {
      lVar5 = 0x20;
      goto LAB_0011c1e1;
    }
    (*p_Var2)(pFVar3);
    pFVar3 = pFVar1;
  } while( true );
}

Assistant:

void FAudio_OPERATIONSET_Execute(FAudio *audio)
{
	FAudio_OPERATIONSET_Operation *op, *next;

	FAudio_PlatformLockMutex(audio->operationLock);
	LOG_MUTEX_LOCK(audio, audio->operationLock)

	op = audio->committedOperations;
	while (op != NULL)
	{
		next = op->next;
		ExecuteOperation(op);
		DeleteOperation(op, audio->pFree);
		op = next;
	}
	audio->committedOperations = NULL;

	FAudio_PlatformUnlockMutex(audio->operationLock);
	LOG_MUTEX_UNLOCK(audio, audio->operationLock)
}